

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdflat.c
# Opt level: O0

void ngram_fwdflat_expand_all(ngram_search_t *ngs)

{
  int iVar1;
  int32 iVar2;
  int local_18;
  int i;
  int n_words;
  ngram_search_t *ngs_local;
  
  ngs->n_expand_words = 0;
  iVar1 = (ngs->base).n_words;
  memset(ngs->expand_word_flag,0,(long)(((ngs->base).n_words + 0x1f) / 0x20) << 2);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    iVar2 = ngram_model_set_known_wid(ngs->lmset,((ngs->base).dict)->word[local_18].basewid);
    if (iVar2 != 0) {
      ngs->fwdflat_wordlist[ngs->n_expand_words] = local_18;
      ngs->expand_word_list[ngs->n_expand_words] = local_18;
      ngs->expand_word_flag[local_18 / 0x20] =
           ngs->expand_word_flag[local_18 / 0x20] | (uint)(1L << ((byte)local_18 & 0x1f));
      ngs->n_expand_words = ngs->n_expand_words + 1;
    }
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
          ,0x52,"Utterance vocabulary contains %d words\n",(ulong)(uint)ngs->n_expand_words);
  ngs->expand_word_list[ngs->n_expand_words] = -1;
  ngs->fwdflat_wordlist[ngs->n_expand_words] = -1;
  return;
}

Assistant:

static void
ngram_fwdflat_expand_all(ngram_search_t *ngs)
{
    int n_words, i;

    /* For all "real words" (not fillers or <s>/</s>) in the dictionary,
     *
     * 1) Add the ones which are in the LM to the fwdflat wordlist
     * 2) And to the expansion list (since we are expanding all)
     */
    ngs->n_expand_words = 0;
    n_words = ps_search_n_words(ngs);
    bitvec_clear_all(ngs->expand_word_flag, ps_search_n_words(ngs));
    for (i = 0; i < n_words; ++i) {
        if (!ngram_model_set_known_wid(ngs->lmset,
                                       dict_basewid(ps_search_dict(ngs),i)))
            continue;
        ngs->fwdflat_wordlist[ngs->n_expand_words] = i;
        ngs->expand_word_list[ngs->n_expand_words] = i;
        bitvec_set(ngs->expand_word_flag, i);
        ngs->n_expand_words++;
    }
    E_INFO("Utterance vocabulary contains %d words\n", ngs->n_expand_words);
    ngs->expand_word_list[ngs->n_expand_words] = -1;
    ngs->fwdflat_wordlist[ngs->n_expand_words] = -1;
}